

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O2

void __thiscall
DIS::RecordSpecification::unmarshal(RecordSpecification *this,DataStream *dataStream)

{
  ulong uVar1;
  RecordSpecificationElement x;
  RecordSpecificationElement local_40;
  
  DataStream::operator>>(dataStream,&this->_numberOfRecordSets);
  std::vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>::
  clear(&this->_recordSets);
  for (uVar1 = 0; uVar1 < this->_numberOfRecordSets; uVar1 = uVar1 + 1) {
    RecordSpecificationElement::RecordSpecificationElement(&local_40);
    RecordSpecificationElement::unmarshal(&local_40,dataStream);
    std::vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>::
    push_back(&this->_recordSets,&local_40);
    RecordSpecificationElement::~RecordSpecificationElement(&local_40);
  }
  return;
}

Assistant:

void RecordSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfRecordSets;

     _recordSets.clear();
     for(size_t idx = 0; idx < _numberOfRecordSets; idx++)
     {
        RecordSpecificationElement x;
        x.unmarshal(dataStream);
        _recordSets.push_back(x);
     }
}